

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

Gia_Man_t * Au_ManDeriveTest(Abc_Ntk_t *pRoot)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  Au_Man_t *pMan_00;
  Abc_Nam_t *pAVar4;
  abctime aVar5;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *vOrder_00;
  Gia_Man_t *pGVar6;
  abctime aVar7;
  abctime aVar8;
  abctime aVar9;
  char *local_78;
  int local_6c;
  int i;
  abctime clk;
  abctime clk3;
  abctime clk2;
  abctime clk1;
  Au_Ntk_t *pNtk;
  Au_Man_t *pMan;
  Abc_Ntk_t *pMod;
  Vec_Ptr_t *vModels;
  Vec_Ptr_t *vOrder;
  Gia_Man_t *pGia;
  char *pModelName;
  Abc_Ntk_t *pRoot_local;
  
  clk1 = 0;
  aVar2 = Abc_Clock();
  aVar3 = Abc_Clock();
  if (pRoot->pDesign == (Abc_Des_t *)0x0) {
    local_78 = pRoot->pName;
  }
  else {
    local_78 = pRoot->pDesign->pName;
  }
  pMan_00 = Au_ManAlloc(local_78);
  pAVar4 = Abc_NamStart(100,0x10);
  pMan_00->pFuncs = pAVar4;
  aVar5 = Abc_Clock();
  clk3 = aVar5 - aVar3;
  p = Abc_NtkCollectHie(pRoot);
  for (local_6c = 0; iVar1 = Vec_PtrSize(p), local_6c < iVar1; local_6c = local_6c + 1) {
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(p,local_6c);
    vOrder_00 = Abc_NtkDfsBoxes(pNtk_00);
    aVar3 = Abc_Clock();
    clk1 = (abctime)Au_NtkDerive(pMan_00,pNtk_00,vOrder_00);
    pNtk_00->iStep = ((Au_Ntk_t *)clk1)->Id;
    pNtk_00->pData = (void *)clk1;
    aVar5 = Abc_Clock();
    clk3 = (aVar5 - aVar3) + clk3;
    Vec_PtrFree(vOrder_00);
  }
  Vec_PtrFree(p);
  Au_ManReorderModels(pMan_00,(Au_Ntk_t *)clk1);
  Au_ManPrintStats(pMan_00);
  Au_ManCountThings(*(Au_Man_t **)(clk1 + 8));
  clk1 = (abctime)Au_ManFindNtkP(pMan_00,"path_0_r_x_lhs");
  if ((Au_Ntk_t *)clk1 == (Au_Ntk_t *)0x0) {
    printf("Could not find module \"%s\".\n","path_0_r_x_lhs");
    clk1 = (abctime)pRoot->pData;
  }
  aVar3 = Abc_Clock();
  pGVar6 = Au_NtkDeriveFlatGia((Au_Ntk_t *)clk1);
  aVar5 = Abc_Clock();
  aVar7 = Abc_Clock();
  Au_ManDelete(pMan_00);
  aVar8 = Abc_Clock();
  aVar9 = Abc_Clock();
  Abc_PrintTime(1,"Time all ",aVar9 - aVar2);
  Abc_PrintTime(1,"Time new ",(aVar8 - aVar7) + clk3);
  Abc_PrintTime(1,"Time GIA ",aVar5 - aVar3);
  return pGVar6;
}

Assistant:

Gia_Man_t * Au_ManDeriveTest( Abc_Ntk_t * pRoot )
{
    extern Vec_Ptr_t * Abc_NtkCollectHie( Abc_Ntk_t * pNtk );

//    char * pModelName = NULL;
    char * pModelName = "path_0_r_x_lhs";
    Gia_Man_t * pGia = NULL;
    Vec_Ptr_t * vOrder, * vModels;
    Abc_Ntk_t * pMod;
    Au_Man_t * pMan;
    Au_Ntk_t * pNtk = NULL;
    abctime clk1, clk2 = 0, clk3 = 0, clk = Abc_Clock();
    int i;

    clk1 = Abc_Clock();
    pMan = Au_ManAlloc( pRoot->pDesign ? pRoot->pDesign->pName : pRoot->pName );
    pMan->pFuncs = Abc_NamStart( 100, 16 );
    clk2 += Abc_Clock() - clk1;

    vModels = Abc_NtkCollectHie( pRoot );
    Vec_PtrForEachEntry( Abc_Ntk_t *, vModels, pMod, i )
    {
        vOrder = Abc_NtkDfsBoxes( pMod );

        clk1 = Abc_Clock();
        pNtk = Au_NtkDerive( pMan, pMod, vOrder );
        pMod->iStep = pNtk->Id;
        pMod->pData = pNtk;
        clk2 += Abc_Clock() - clk1;

        Vec_PtrFree( vOrder );
    }
    Vec_PtrFree( vModels );
    // order models in topological order
    Au_ManReorderModels( pMan, pNtk );

    // print statistics
    Au_ManPrintStats( pMan );
    Au_ManCountThings( pNtk->pMan );

    // select network
    if ( pModelName )
    {
        pNtk = Au_ManFindNtkP( pMan, pModelName );
        if ( pNtk == NULL )
            printf( "Could not find module \"%s\".\n", pModelName );
    }
    if ( pNtk == NULL )
        pNtk = (Au_Ntk_t *)pRoot->pData;

  
//    if ( !Abc_NtkCheckRecursive(pRoot) )
    {
        clk1 = Abc_Clock();
        pGia = Au_NtkDeriveFlatGia( pNtk );
        clk3 = Abc_Clock() - clk1;
//        printf( "GIA objects max = %d.\n", pMan->nGiaObjMax );
    }

//    clk1 = Abc_Clock();
//    Au_NtkSuppSizeTest( (Au_Ntk_t *)pRoot->pData );
//    clk4 = Abc_Clock() - clk1;

    clk1 = Abc_Clock();
    Au_ManDelete( pMan );
    clk2 += Abc_Clock() - clk1;
    
    Abc_PrintTime( 1, "Time all ", Abc_Clock() - clk );
    Abc_PrintTime( 1, "Time new ", clk2 );
    Abc_PrintTime( 1, "Time GIA ", clk3 );
//    Abc_PrintTime( 1, "Time supp", clk4 );
    return pGia;
}